

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChArchiveOut::out<chrono::ChMarker>
          (ChArchiveOut *this,ChNameValue<std::shared_ptr<chrono::ChMarker>_> *bVal)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  mapped_type *pmVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  mapped_type mVar8;
  __hash_code __code;
  element_type *mvalp;
  bool already_stored;
  size_t obj_ID;
  ChValueSpecific<chrono::ChMarker> specVal;
  bool local_61;
  size_t local_60;
  ChValueSpecific<chrono::ChMarker> local_58;
  
  mvalp = (element_type *)0x0;
  if (this->cut_all_pointers == false) {
    mvalp = (bVal->_value->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  uVar1 = (this->cut_pointers)._M_h._M_bucket_count;
  uVar4 = (ulong)mvalp % uVar1;
  p_Var6 = (this->cut_pointers)._M_h._M_buckets[uVar4];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var6->_M_nxt, p_Var5 = p_Var6, mvalp != (element_type *)p_Var7[1]._M_nxt)) {
    while (p_Var2 = p_Var7->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var5 = p_Var7, p_Var7 = p_Var2, mvalp == (element_type *)p_Var2[1]._M_nxt))
      goto LAB_005130f7;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_005130f7:
  if ((p_Var5 != (__node_base_ptr)0x0) && (p_Var5->_M_nxt != (_Hash_node_base *)0x0)) {
    mvalp = (ChMarker *)0x0;
  }
  local_61 = false;
  local_60 = 0;
  uVar1 = (this->external_ptr_id)._M_h._M_bucket_count;
  uVar4 = (ulong)mvalp % uVar1;
  p_Var6 = (this->external_ptr_id)._M_h._M_buckets[uVar4];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var5 = p_Var6, mvalp != (ChMarker *)p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var5 = p_Var6, mvalp == (ChMarker *)p_Var2[1]._M_nxt)) goto LAB_00513174;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_00513174:
  if ((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) {
    PutPointer(this,mvalp,&local_61,&local_60);
    mVar8 = 0;
  }
  else {
    local_61 = true;
    local_58.super_ChValue._vptr_ChValue = (_func_int **)mvalp;
    pmVar3 = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->external_ptr_id,(key_type *)&local_58);
    mVar8 = *pmVar3;
  }
  ChValueSpecific<chrono::ChMarker>::ChValueSpecific(&local_58,mvalp,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xd])(this,&local_58,(ulong)local_61,local_60,mVar8);
  local_58.super_ChValue._vptr_ChValue = (_func_int **)&PTR__ChValue_00b2abb0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.super_ChValue._name._M_dataplus._M_p != &local_58.super_ChValue._name.field_2) {
    operator_delete(local_58.super_ChValue._name._M_dataplus._M_p,
                    local_58.super_ChValue._name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void out     (ChNameValue< std::shared_ptr<T> > bVal) {
          
          T* mptr = bVal.value().get();

          if (this->cut_all_pointers)
              mptr = 0;
          if (this->cut_pointers.find((void*)mptr) != this->cut_pointers.end())
              mptr = 0;
          bool already_stored = false;  
          size_t obj_ID = 0; 
          size_t ext_ID = 0;
          if (this->external_ptr_id.find(static_cast<void*>(mptr)) != this->external_ptr_id.end()) {
              already_stored = true;
              ext_ID = external_ptr_id[static_cast<void*>(mptr)];
          }
          else {
              PutPointer(mptr, already_stored, obj_ID);
          }
          ChValueSpecific< T > specVal(*mptr, bVal.name(), bVal.flags());
          this->out_ref( 
              specVal,
              already_stored, 
              obj_ID,
              ext_ID); // note, this class name is not platform independent
      }